

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_sl.c
# Opt level: O3

uint64_t sylvan_skiplist_get(sylvan_skiplist_t l,MTBDD dd)

{
  ulong uVar1;
  uint uVar2;
  uint uVar4;
  ulong uVar5;
  ulong uVar3;
  
  if ((dd & 0x7fffffffffffffff) == 0) {
    return 0;
  }
  uVar4 = 0xd;
  uVar5 = 0;
  do {
    uVar3 = uVar5;
    do {
      uVar5 = uVar3;
      uVar2 = l->buckets[uVar5].next[uVar4] & 0x7fffffff;
      uVar3 = (ulong)uVar2;
      if (uVar2 == 0) break;
      uVar1 = l->buckets[uVar3].dd;
      if (uVar1 == dd) {
        return uVar3;
      }
    } while (uVar1 < dd);
    if ((ulong)uVar4 == 0) {
      return 0;
    }
    uVar4 = uVar4 - 1;
  } while( true );
}

Assistant:

uint64_t
sylvan_skiplist_get(sylvan_skiplist_t l, MTBDD dd)
{
    if (dd == mtbdd_false || dd == mtbdd_true) return 0;

    uint32_t loc = 0, k = SL_DEPTH-1;
    for (;;) {
        /* invariant: [loc].dd < dd */
        /* note: this is always true for loc==0 */
        sl_bucket *e = l->buckets + loc;
        uint32_t loc_next = atomic_load_explicit(e->next+k, memory_order_acquire) & 0x7fffffff;
        if (loc_next != 0 && l->buckets[loc_next].dd == dd) {
            /* found */
            return loc_next;
        } else if (loc_next != 0 && l->buckets[loc_next].dd < dd) {
            /* go right */
            loc = loc_next;
        } else if (k > 0) {
            /* go down */
            k--;
        } else {
            return 0;
        }
    }
}